

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaK_storevar(FuncState *fs,expdesc *var,expdesc *ex)

{
  int iVar1;
  int e_2;
  int e_1;
  int e;
  expdesc *ex_local;
  expdesc *var_local;
  FuncState *fs_local;
  
  switch(var->k) {
  case VLOCAL:
    freeexp(fs,ex);
    exp2reg(fs,ex,(var->u).s.info);
    return;
  case VUPVAL:
    iVar1 = luaK_exp2anyreg(fs,ex);
    luaK_codeABC(fs,OP_SETUPVAL,iVar1,(var->u).s.info,0);
    break;
  case VGLOBAL:
    iVar1 = luaK_exp2anyreg(fs,ex);
    luaK_codeABx(fs,OP_SETGLOBAL,iVar1,(var->u).s.info);
    break;
  case VINDEXED:
    iVar1 = luaK_exp2RK(fs,ex);
    luaK_codeABC(fs,OP_SETTABLE,(var->u).s.info,(var->u).s.aux,iVar1);
  }
  freeexp(fs,ex);
  return;
}

Assistant:

static void luaK_storevar(FuncState*fs,expdesc*var,expdesc*ex){
switch(var->k){
case VLOCAL:{
freeexp(fs,ex);
exp2reg(fs,ex,var->u.s.info);
return;
}
case VUPVAL:{
int e=luaK_exp2anyreg(fs,ex);
luaK_codeABC(fs,OP_SETUPVAL,e,var->u.s.info,0);
break;
}
case VGLOBAL:{
int e=luaK_exp2anyreg(fs,ex);
luaK_codeABx(fs,OP_SETGLOBAL,e,var->u.s.info);
break;
}
case VINDEXED:{
int e=luaK_exp2RK(fs,ex);
luaK_codeABC(fs,OP_SETTABLE,var->u.s.info,var->u.s.aux,e);
break;
}
default:{
break;
}
}
freeexp(fs,ex);
}